

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertionexception.h
# Opt level: O2

void __thiscall
snowhouse::AssertionException::AssertionException
          (AssertionException *this,string *message,string *fileName,uint line)

{
  *(undefined ***)this = &PTR__AssertionException_00120d30;
  std::__cxx11::string::string((string *)&this->m_message,(string *)message);
  std::__cxx11::string::string((string *)&this->m_fileName,(string *)fileName);
  this->m_line = line;
  return;
}

Assistant:

AssertionException(const std::string& message, const std::string& fileName, unsigned int line)
        : m_message(message), m_fileName(fileName), m_line(line)
      {}